

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

int __thiscall
HashMap<Socket_*,_unsigned_int>::remove(HashMap<Socket_*,_unsigned_int> *this,char *__filename)

{
  Iterator it;
  Item *local_8;
  
  if (this->data != (Item **)0x0) {
    for (local_8 = this->data[((ulong)*(Socket **)__filename >> 3) % this->capacity];
        local_8 != (Item *)0x0; local_8 = local_8->nextCell) {
      if (local_8->key == *(Socket **)__filename) goto LAB_0010cae7;
    }
  }
  local_8 = (this->_end).item;
LAB_0010cae7:
  if (local_8 != (this->_end).item) {
    remove(this,(char *)&local_8);
  }
  return (int)local_8;
}

Assistant:

void remove(const T& key)
  {
    Iterator it = find(key);
    if(it != _end)
      remove(it);
  }